

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_global(REF_CELL ref_cell,REF_NODE ref_node,REF_LONG **global)

{
  REF_MPI pRVar1;
  REF_LONG **ppRVar2;
  uint uVar3;
  REF_LONG *pRVar4;
  void *array;
  ulong uVar5;
  undefined8 uVar6;
  REF_STATUS RVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  int cell;
  long lVar12;
  REF_INT part;
  REF_INT ncell;
  REF_MPI local_40;
  REF_LONG **local_38;
  
  uVar8 = (ulong)ref_cell->max;
  if ((long)uVar8 < 0) {
    pcVar9 = "malloc *global of REF_LONG negative";
    uVar6 = 0x5c6;
LAB_0011f40d:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar6,
           "ref_cell_global",pcVar9);
    RVar7 = 1;
  }
  else {
    pRVar1 = ref_node->ref_mpi;
    pRVar4 = (REF_LONG *)malloc(uVar8 * 8);
    *global = pRVar4;
    if (pRVar4 == (REF_LONG *)0x0) {
      pcVar9 = "malloc *global of REF_LONG NULL";
      uVar6 = 0x5c6;
    }
    else {
      ncell = 0;
      iVar10 = 0;
      local_40 = pRVar1;
      local_38 = global;
      for (cell = 0; pRVar1 = local_40, cell < (int)uVar8; cell = cell + 1) {
        if (ref_cell->c2n[(long)cell * (long)ref_cell->size_per] != -1) {
          uVar3 = ref_cell_part(ref_cell,ref_node,cell,&part);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar9 = "cell part";
            uVar6 = 0x5ca;
            goto LAB_0011f4d1;
          }
          if (local_40->id == part) {
            iVar10 = iVar10 + 1;
            ncell = iVar10;
          }
        }
        uVar8 = (ulong)(uint)ref_cell->max;
      }
      if ((long)local_40->n < 0) {
        pcVar9 = "malloc counts of REF_INT negative";
        uVar6 = 0x5d0;
        goto LAB_0011f40d;
      }
      array = malloc((long)local_40->n << 2);
      if (array != (void *)0x0) {
        uVar3 = ref_mpi_allgather(pRVar1,&ncell,array,1);
        ppRVar2 = local_38;
        if (uVar3 == 0) {
          uVar3 = pRVar1->id;
          uVar5 = 0;
          uVar8 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar8 = uVar5;
          }
          lVar12 = 0;
          for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
            lVar12 = lVar12 + *(int *)((long)array + uVar5 * 4);
          }
          free(array);
          for (lVar11 = 0; lVar11 < ref_cell->max; lVar11 = lVar11 + 1) {
            if (ref_cell->c2n[(long)(int)lVar11 * (long)ref_cell->size_per] != -1) {
              uVar3 = ref_cell_part(ref_cell,ref_node,(int)lVar11,&part);
              if (uVar3 != 0) {
                uVar8 = (ulong)uVar3;
                pcVar9 = "cell part";
                uVar6 = 0x5d7;
                goto LAB_0011f4d1;
              }
              if (local_40->id == part) {
                (*ppRVar2)[lVar11] = lVar12;
                lVar12 = lVar12 + 1;
              }
            }
          }
          uVar3 = ref_cell_ghost_long(ref_cell,ref_node,*ppRVar2);
          if (uVar3 == 0) {
            return 0;
          }
          uVar8 = (ulong)uVar3;
          pcVar9 = "ghost";
          uVar6 = 0x5de;
        }
        else {
          uVar8 = (ulong)uVar3;
          pcVar9 = "gather size";
          uVar6 = 0x5d1;
        }
LAB_0011f4d1:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               uVar6,"ref_cell_global",uVar8,pcVar9);
        return (REF_STATUS)uVar8;
      }
      pcVar9 = "malloc counts of REF_INT NULL";
      uVar6 = 0x5d0;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar6,
           "ref_cell_global",pcVar9);
    RVar7 = 2;
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_cell_global(REF_CELL ref_cell, REF_NODE ref_node,
                                   REF_LONG **global) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT ncell, cell, part, *counts, proc;
  REF_LONG offset;

  ref_malloc(*global, ref_cell_max(ref_cell), REF_LONG);

  ncell = 0;
  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (ref_mpi_rank(ref_mpi) == part) {
      ncell++;
    }
  }

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &ncell, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) offset += counts[proc];
  ref_free(counts);

  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (ref_mpi_rank(ref_mpi) == part) {
      (*global)[cell] = offset;
      offset++;
    }
  }

  RSS(ref_cell_ghost_long(ref_cell, ref_node, *global), "ghost");

  return REF_SUCCESS;
}